

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack16_32(uint32_t *in,uint32_t *out)

{
  undefined6 uVar1;
  undefined1 auVar2 [14];
  undefined1 auVar3 [22];
  undefined1 auVar4 [30];
  undefined1 auVar5 [38];
  undefined1 auVar6 [46];
  undefined1 auVar7 [54];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined2 in_XMM4_Wa;
  undefined2 in_XMM4_We;
  undefined2 in_YMM4_H;
  undefined2 in_register_00001318;
  undefined2 in_register_00001320;
  undefined2 in_register_00001328;
  undefined2 in_register_00001330;
  undefined2 in_register_00001338;
  
  auVar8 = vpmovsxbd_avx512f(_DAT_001a02c0);
  auVar9 = vpermd_avx512f(auVar8,ZEXT3264(*(undefined1 (*) [32])in));
  auVar10 = vpbroadcastq_avx512f(ZEXT816(0x100000ffff));
  auVar11 = vpblendmw_avx512bw(auVar9,ZEXT1664((undefined1  [16])0x0));
  auVar12._2_2_ = auVar11._2_2_;
  auVar12._0_2_ = in_XMM4_Wa;
  auVar12._10_2_ = auVar11._10_2_;
  auVar12._8_2_ = in_XMM4_We;
  auVar12._18_2_ = auVar11._18_2_;
  auVar12._16_2_ = in_YMM4_H;
  auVar12._26_2_ = auVar11._26_2_;
  auVar12._24_2_ = in_register_00001318;
  auVar12._34_2_ = auVar11._34_2_;
  auVar12._32_2_ = in_register_00001320;
  auVar12._42_2_ = auVar11._42_2_;
  auVar12._40_2_ = in_register_00001328;
  auVar12._50_2_ = auVar11._50_2_;
  auVar12._48_2_ = in_register_00001330;
  auVar12._58_2_ = auVar11._58_2_;
  auVar12._56_2_ = in_register_00001338;
  auVar9 = vpsrlvd_avx512f(auVar9,auVar10);
  auVar12._4_4_ = auVar9._4_4_;
  auVar12._12_4_ = auVar9._12_4_;
  auVar12._20_4_ = auVar9._20_4_;
  auVar12._28_4_ = auVar9._28_4_;
  auVar12._36_4_ = auVar9._36_4_;
  auVar12._44_4_ = auVar9._44_4_;
  auVar12._52_4_ = auVar9._52_4_;
  auVar12._60_4_ = auVar9._60_4_;
  auVar9 = vmovdqu64_avx512f(auVar12);
  *(undefined1 (*) [64])out = auVar9;
  auVar9 = vpermd_avx512f(auVar8,ZEXT3264(*(undefined1 (*) [32])(in + 8)));
  auVar11 = vpblendmw_avx512bw(auVar9,ZEXT1664((undefined1  [16])0x0));
  auVar13._2_2_ = auVar11._2_2_;
  auVar13._0_2_ = auVar8._0_2_;
  uVar1 = CONCAT24(auVar11._10_2_,auVar8._6_4_);
  auVar2._6_2_ = auVar8._12_2_;
  auVar2._0_6_ = uVar1;
  auVar2._8_2_ = auVar8._14_2_;
  auVar2._10_2_ = auVar8._16_2_;
  auVar2._12_2_ = auVar11._18_2_;
  auVar3._14_2_ = auVar8._20_2_;
  auVar3._0_14_ = auVar2;
  auVar3._16_2_ = auVar8._22_2_;
  auVar3._18_2_ = auVar8._24_2_;
  auVar3._20_2_ = auVar11._26_2_;
  auVar4._22_2_ = auVar8._28_2_;
  auVar4._0_22_ = auVar3;
  auVar4._24_2_ = auVar8._30_2_;
  auVar4._26_2_ = auVar8._32_2_;
  auVar4._28_2_ = auVar11._34_2_;
  auVar5._30_2_ = auVar8._36_2_;
  auVar5._0_30_ = auVar4;
  auVar5._32_2_ = auVar8._38_2_;
  auVar5._34_2_ = auVar8._40_2_;
  auVar5._36_2_ = auVar11._42_2_;
  auVar6._38_2_ = auVar8._44_2_;
  auVar6._0_38_ = auVar5;
  auVar6._40_2_ = auVar8._46_2_;
  auVar6._42_2_ = auVar8._48_2_;
  auVar6._44_2_ = auVar11._50_2_;
  auVar7._46_2_ = auVar8._52_2_;
  auVar7._0_46_ = auVar6;
  auVar7._48_2_ = auVar8._54_2_;
  auVar7._50_2_ = auVar8._56_2_;
  auVar7._52_2_ = auVar11._58_2_;
  auVar9 = vpsrlvd_avx512f(auVar9,auVar10);
  auVar13._4_4_ = auVar9._4_4_;
  auVar13._8_4_ = (int)((uint6)uVar1 >> 0x10);
  auVar13._12_4_ = auVar9._12_4_;
  auVar13._16_4_ = auVar2._10_4_;
  auVar13._20_4_ = auVar9._20_4_;
  auVar13._24_4_ = auVar3._18_4_;
  auVar13._28_4_ = auVar9._28_4_;
  auVar13._32_4_ = auVar4._26_4_;
  auVar13._36_4_ = auVar9._36_4_;
  auVar13._40_4_ = auVar5._34_4_;
  auVar13._44_4_ = auVar9._44_4_;
  auVar13._48_4_ = auVar6._42_4_;
  auVar13._52_4_ = auVar9._52_4_;
  auVar13._60_4_ = auVar9._60_4_;
  auVar13._56_4_ = auVar7._50_4_;
  auVar9 = vmovdqu64_avx512f(auVar13);
  *(undefined1 (*) [64])(out + 0x10) = auVar9;
  return in + 0x10;
}

Assistant:

const uint32_t *__fastunpack16_32(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;

  return in;
}